

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O2

void ans_byte_decompress(void *dst,size_t to_decode,void *cSrc,size_t cSrcSize)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t state_a;
  uint64_t state_b;
  uint64_t state_c;
  uint64_t state_d;
  ans_byte_decode ans_frame;
  uint64_t local_490;
  uint64_t local_488;
  uint64_t local_480;
  uint64_t local_478;
  long *local_470;
  ans_byte_decode local_468;
  
  ans_byte_decode::load(&local_468,(uint8_t *)cSrc);
  local_470 = (long *)((long)cSrc + (cSrcSize - 0x20));
  uVar2 = to_decode & 0xfffffffffffffffc;
  local_478 = local_470[3] + local_468.lower_bound;
  local_480 = local_470[2] + local_468.lower_bound;
  local_488 = local_470[1] + local_468.lower_bound;
  local_490 = local_468.lower_bound + *local_470;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 4) {
    uVar1 = ans_byte_decode::decode_sym(&local_468,&local_478,(uint8_t **)&local_470);
    *(uint8_t *)((long)dst + uVar3) = uVar1;
    uVar1 = ans_byte_decode::decode_sym(&local_468,&local_480,(uint8_t **)&local_470);
    *(uint8_t *)((long)dst + uVar3 + 1) = uVar1;
    uVar1 = ans_byte_decode::decode_sym(&local_468,&local_488,(uint8_t **)&local_470);
    *(uint8_t *)((long)dst + uVar3 + 2) = uVar1;
    uVar1 = ans_byte_decode::decode_sym(&local_468,&local_490,(uint8_t **)&local_470);
    *(uint8_t *)((long)dst + uVar3 + 3) = uVar1;
  }
  for (; to_decode != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = ans_byte_decode::decode_sym(&local_468,&local_490,(uint8_t **)&local_470);
    *(uint8_t *)((long)dst + uVar2) = uVar1;
  }
  std::_Vector_base<dec_entry,_std::allocator<dec_entry>_>::~_Vector_base
            (&local_468.table.super__Vector_base<dec_entry,_std::allocator<dec_entry>_>);
  return;
}

Assistant:

void ans_byte_decompress(
    void* dst, size_t to_decode, const void* cSrc, size_t cSrcSize)
{
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_byte_decode::load(in_u8);
    in_u8 += cSrcSize;

    auto state_d = ans_frame.init_state(in_u8);
    auto state_c = ans_frame.init_state(in_u8);
    auto state_b = ans_frame.init_state(in_u8);
    auto state_a = ans_frame.init_state(in_u8);

    size_t cur_idx = 0;
    auto out_u8 = reinterpret_cast<uint8_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % 4);
    while (cur_idx != fast_decode) {
        out_u8[cur_idx] = ans_frame.decode_sym(state_d, in_u8);
        out_u8[cur_idx + 1] = ans_frame.decode_sym(state_c, in_u8);
        out_u8[cur_idx + 2] = ans_frame.decode_sym(state_b, in_u8);
        out_u8[cur_idx + 3] = ans_frame.decode_sym(state_a, in_u8);
        cur_idx += 4;
    }
    while (cur_idx != to_decode) {
        out_u8[cur_idx++] = ans_frame.decode_sym(state_a, in_u8);
    }
}